

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int nsc_get_cb(lws_cache_nscookiejar_t *cache,void *opaque,int flags,char *buf,size_t size)

{
  undefined8 uVar1;
  long lVar2;
  code *pcVar3;
  int iVar4;
  size_t sVar5;
  char *format;
  uint8_t *q;
  uint8_t *p;
  char tag [200];
  void *local_108;
  uint8_t *local_100;
  char local_f8 [200];
  
  if (*opaque == 0) {
    if ((flags & 1U) != 0) {
      iVar4 = nsc_line_to_tag(buf,size,local_f8,200,(lws_usec_t *)((long)opaque + 0x28));
      if (iVar4 != 0) {
        format = "%s: can\'t get tag\n";
        iVar4 = 1;
LAB_00110362:
        _lws_log(iVar4,format,"nsc_get_cb");
        return 0;
      }
      _lws_log(0x10,"%s: %s %s\n","nsc_get_cb",*(undefined8 *)((long)opaque + 8),local_f8);
      iVar4 = strcmp(*(char **)((long)opaque + 8),local_f8);
      if (iVar4 != 0) {
        format = "%s: no match\n";
        iVar4 = 0x10;
        goto LAB_00110362;
      }
      _lws_log(0x10,"%s: IS match\n","nsc_get_cb");
      if ((flags & 2U) != 0) {
        **(size_t **)((long)opaque + 0x18) = size;
        iVar4 = (**(code **)(*(long *)(*(long *)((long)opaque + 0x20) + 0x20) + 0x18))
                          (*(long *)((long)opaque + 0x20),*(undefined8 *)((long)opaque + 8),buf,size
                           ,*(undefined8 *)((long)opaque + 0x28),
                           *(undefined8 *)((long)opaque + 0x10));
        return -(uint)(iVar4 != 0) | 1;
      }
      goto LAB_0011021e;
    }
LAB_00110289:
    iVar4 = 0;
  }
  else {
LAB_0011021e:
    iVar4 = lws_buflist_append_segment((lws_buflist **)opaque,(uint8_t *)buf,size);
    if (iVar4 == 0) {
      if ((flags & 2U) == 0) goto LAB_00110289;
      **(size_t **)((long)opaque + 0x18) = size;
      uVar1 = *(undefined8 *)((long)opaque + 8);
      lVar2 = *(long *)((long)opaque + 0x20);
      pcVar3 = *(code **)(*(long *)(lVar2 + 0x20) + 0x18);
      sVar5 = lws_buflist_total_len((lws_buflist **)opaque);
      iVar4 = (*pcVar3)(lVar2,uVar1,0,sVar5,*(undefined8 *)((long)opaque + 0x28),&local_108);
      if (iVar4 == 0) {
        **(long **)((long)opaque + 0x10) = (long)local_108;
        do {
          sVar5 = lws_buflist_next_segment_len((lws_buflist **)opaque,&local_100);
          memcpy(local_108,local_100,sVar5);
          local_108 = (void *)((long)local_108 + sVar5);
          lws_buflist_use_segment((lws_buflist **)opaque,sVar5);
        } while (*opaque != 0);
        return 1;
      }
    }
    lws_buflist_destroy_all_segments((lws_buflist **)opaque);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int
nsc_get_cb(lws_cache_nscookiejar_t *cache, void *opaque, int flags,
	   const char *buf, size_t size)
{
	struct nsc_get_ctx *ctx = (struct nsc_get_ctx *)opaque;
	char tag[200];
	uint8_t *q;

	if (ctx->buflist)
		goto collect;

	if (!(flags & LCN_SOL))
		return NIR_CONTINUE;

	if (nsc_line_to_tag(buf, size, tag, sizeof(tag), &ctx->expiry)) {
		lwsl_err("%s: can't get tag\n", __func__);
		return NIR_CONTINUE;
	}

	lwsl_cache("%s: %s %s\n", __func__, ctx->specific_key, tag);

	if (strcmp(ctx->specific_key, tag)) {
		lwsl_cache("%s: no match\n", __func__);
		return NIR_CONTINUE;
	}

	/* it's a match */

	lwsl_cache("%s: IS match\n", __func__);

	if (!(flags & LCN_EOL))
		goto collect;

	/* it all fit in the buffer, let's create it in L1 now */

	*ctx->psize = size;
	if (ctx->l1->info.ops->write(ctx->l1,
				     ctx->specific_key, (const uint8_t *)buf,
				     size, ctx->expiry, (void **)ctx->pdata))
		return NIR_FINISH_ERROR;

	return NIR_FINISH_OK;

collect:
	/*
	 * it's bigger than one buffer-load, we have to stash what we're getting
	 * on a buflist and create it when we have it all
	 */

	if (lws_buflist_append_segment(&ctx->buflist, (const uint8_t *)buf,
				       size))
		goto cleanup;

	if (!(flags & LCN_EOL))
		return NIR_CONTINUE;

	/* we have all the payload, create the L1 entry without payload yet */

	*ctx->psize = size;
	if (ctx->l1->info.ops->write(ctx->l1, ctx->specific_key, NULL,
				     lws_buflist_total_len(&ctx->buflist),
				     ctx->expiry, (void **)&q))
		goto cleanup;
	*ctx->pdata = q;

	/* dump the buflist into the L1 cache entry */

	do {
		uint8_t *p;
		size_t len = lws_buflist_next_segment_len(&ctx->buflist, &p);

		memcpy(q, p, len);
		q += len;

		lws_buflist_use_segment(&ctx->buflist, len);
	} while (ctx->buflist);

	return NIR_FINISH_OK;

cleanup:
	lws_buflist_destroy_all_segments(&ctx->buflist);

	return NIR_FINISH_ERROR;
}